

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

enable_if_t<HasSize<vector<Image>_>::value_&&_HasData<vector<Image>_>::value,_std::ostream_&>
pbrt::detail::operator<<
          (ostream *os,vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *v)

{
  ostream *poVar1;
  ulong uVar2;
  Image *this;
  string local_50;
  
  std::operator<<(os,"[ ");
  this = v->ptr;
  for (uVar2 = 0; uVar2 < v->nStored; uVar2 = uVar2 + 1) {
    Image::ToString_abi_cxx11_(&local_50,this);
    std::operator<<(os,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (uVar2 < v->nStored - 1) {
      std::operator<<(os,", ");
    }
    this = this + 1;
  }
  poVar1 = std::operator<<(os," ]");
  return poVar1;
}

Assistant:

inline std::enable_if_t<HasSize<T>::value && HasData<T>::value, std::ostream &>
operator<<(std::ostream &os, const T &v) {
    os << "[ ";
    auto ptr = v.data();
    for (size_t i = 0; i < v.size(); ++i) {
        os << ptr[i];
        if (i < v.size() - 1)
            os << ", ";
    }
    return os << " ]";
}